

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua.c
# Opt level: O1

int msghandler(lua_State *L)

{
  int iVar1;
  char *pcVar2;
  
  pcVar2 = lua_tolstring(L,1,(size_t *)0x0);
  if (pcVar2 == (char *)0x0) {
    iVar1 = luaL_callmeta(L,1,"__tostring");
    if ((iVar1 != 0) && (iVar1 = lua_type(L,-1), iVar1 == 4)) {
      return 1;
    }
    iVar1 = lua_type(L,1);
    pcVar2 = lua_typename(L,iVar1);
    pcVar2 = lua_pushfstring(L,"(error object is a %s value)",pcVar2);
  }
  luaL_traceback(L,L,pcVar2,1);
  return 1;
}

Assistant:

static int msghandler (lua_State *L) {
  const char *msg = lua_tostring(L, 1);
  if (msg == NULL) {  /* is error object not a string? */
    if (luaL_callmeta(L, 1, "__tostring") &&  /* does it have a metamethod */
        lua_type(L, -1) == LUA_TSTRING)  /* that produces a string? */
      return 1;  /* that is the message */
    else
      msg = lua_pushfstring(L, "(error object is a %s value)",
                               luaL_typename(L, 1));
  }
  luaL_traceback(L, L, msg, 1);  /* append a standard traceback */
  return 1;  /* return the traceback */
}